

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::CollectMemOpInfo
          (GlobOpt *this,Instr *instrBegin,Instr *instr,Value *src1Val,Value *src2Val)

{
  Instr **ppIVar1;
  OpCode OVar2;
  Loop *loop;
  Type pSVar3;
  Opnd *this_00;
  BasicBlock *pBVar4;
  SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  InductionVariableChangeInfoMap *this_03;
  code *pcVar5;
  bool bVar6;
  OpndKind OVar7;
  uint uVar8;
  uint uVar9;
  undefined4 *puVar10;
  JITTimeFunctionBody *pJVar11;
  FunctionJITTimeInfo *pFVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  GlobOpt *this_04;
  GlobOpt *pGVar15;
  InductionVariable *pIVar16;
  RegOpnd *pRVar17;
  Value *pVVar18;
  Instr *pIVar19;
  Type *ppMVar20;
  MemCopyCandidate *pMVar21;
  StackSym *pSVar22;
  StackSym *pSVar23;
  IntConstOpnd *pIVar24;
  InductionVariableChangeInfo *pIVar25;
  byte bVar26;
  ulong uVar27;
  SymID SVar28;
  Instr *pIVar29;
  Instr *instr_00;
  SymID local_c8 [2];
  char16 debugStringBuffer [42];
  uint local_34 [2];
  int constValue;
  
  if (this->currentBlock->loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x86d,"(this->currentBlock->loop)","this->currentBlock->loop");
    if (!bVar6) goto LAB_0044d8b8;
    *puVar10 = 0;
  }
  loop = this->currentBlock->loop;
  pSVar3 = (loop->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  if ((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)pSVar3 == &loop->blockList) {
    return false;
  }
  if ((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)pSVar3->next->next !=
      &loop->blockList) {
    return false;
  }
  if ((((byte)loop->loopFlags >> 1 | ~(byte)loop->loopFlags) & 1) == 0) {
    if (DAT_015d346a == '\x01') {
      pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
      pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar8,uVar9);
      if (!bVar6) {
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
        pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemSetPhase,uVar8,uVar9);
        if (!bVar6) {
          pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
          pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
          uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
          bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemCopyPhase,uVar8,uVar9);
          if (!bVar6) goto LAB_0044d1a0;
        }
      }
      Output::Print(L"TRACE MemOp:");
      pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar11);
      pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_c8);
      uVar8 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar8);
      Output::Print(L"minimum loop count not reached");
      if (instr != (Instr *)0x0) {
        IR::Instr::DumpByteCodeOffset(instr);
        pcVar13 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
        Output::Print(L" (%s)",pcVar13);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
    goto LAB_0044d1a0;
  }
  if ((loop->field_0x179 & 4) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x87d,"(loop->doMemOp)","loop->doMemOp");
    if (!bVar6) goto LAB_0044d8b8;
    *puVar10 = 0;
  }
  OVar2 = instr->m_opcode;
  if (OVar2 < StElemI_A_Strict) {
    if (OVar2 == LdElemI_A) {
      bVar6 = CollectMemOpLdElementI(this,instr,loop);
    }
    else {
      if (OVar2 != StElemI_A) goto LAB_0044d302;
LAB_0044d0cc:
      bVar6 = CollectMemOpStElementI(this,instr,loop);
    }
    if (bVar6 != false) {
      return true;
    }
LAB_0044d1a0:
    loop->field_0x179 = loop->field_0x179 & 0xfb;
    return false;
  }
  if (OVar2 == Sub_I4) {
    bVar26 = 0;
  }
  else {
    bVar26 = 0x80;
    if (OVar2 != Add_I4) {
      if (OVar2 != StElemI_A_Strict) goto LAB_0044d302;
      goto LAB_0044d0cc;
    }
  }
  pIVar19 = instr->m_next;
  pSVar22 = IR::Opnd::GetStackSym(instr->m_dst);
  if ((pSVar22 == (StackSym *)0x0) ||
     (OVar7 = IR::Opnd::GetKind(instr->m_dst), OVar7 != OpndKindReg)) {
LAB_0044d230:
    bVar6 = false;
  }
  else {
    pSVar22 = IR::Opnd::GetStackSym(instr->m_dst);
    pSVar23 = IR::Opnd::GetStackSym(instr->m_src1);
    if (pSVar22 != pSVar23) {
      if ((((pIVar19 != (Instr *)0x0) && (pIVar19->m_opcode == Ld_A)) &&
          (OVar7 = IR::Opnd::GetKind(pIVar19->m_src1), OVar7 == OpndKindReg)) &&
         (OVar7 = IR::Opnd::GetKind(pIVar19->m_dst), OVar7 == OpndKindReg)) {
        pSVar22 = IR::Opnd::GetStackSym(instr->m_dst);
        if (pSVar22 == (StackSym *)0x0) {
          pSVar22 = (StackSym *)0x0;
        }
        else if (pSVar22->m_type != TyVar) {
          pSVar22 = StackSym::GetVarEquivSym(pSVar22,(Func *)0x0);
        }
        if (pSVar22 == (StackSym *)0x0) {
          SVar28 = 0xffffffff;
        }
        else {
          SVar28 = (pSVar22->super_Sym).m_id;
        }
        pSVar22 = IR::Opnd::GetStackSym(pIVar19->m_src1);
        if (SVar28 == (pSVar22->super_Sym).m_id) {
          pSVar22 = IR::Opnd::GetStackSym(instr->m_src1);
          if (pSVar22 == (StackSym *)0x0) {
            pSVar22 = (StackSym *)0x0;
          }
          else if (pSVar22->m_type != TyVar) {
            pSVar22 = StackSym::GetVarEquivSym(pSVar22,(Func *)0x0);
          }
          if (pSVar22 == (StackSym *)0x0) {
            SVar28 = 0xffffffff;
          }
          else {
            SVar28 = (pSVar22->super_Sym).m_id;
          }
          pSVar22 = IR::Opnd::GetStackSym(pIVar19->m_dst);
          if (SVar28 == (pSVar22->super_Sym).m_id) goto LAB_0044d22b;
        }
      }
      goto LAB_0044d230;
    }
LAB_0044d22b:
    bVar6 = true;
  }
  this_04 = (GlobOpt *)IR::Opnd::GetStackSym(instr->m_src1);
  if (this_04 == (GlobOpt *)0x0) {
    pGVar15 = (GlobOpt *)0x0;
  }
  else {
    pGVar15 = this_04;
    if (*(char *)((long)&this_04->intConstantToValueMap + 4) != '\x17') {
      pGVar15 = (GlobOpt *)StackSym::GetVarEquivSym((StackSym *)this_04,(Func *)0x0);
    }
  }
  if (pGVar15 == (GlobOpt *)0x0) {
    local_c8[0] = 0xffffffff;
  }
  else {
    local_c8[0] = *(SymID *)&pGVar15->intConstantToStackSymMap;
  }
  if ((!bVar6) ||
     (pIVar16 = GetInductionVariable(this_04,local_c8[0],this->currentBlock->loop),
     pIVar16 == (InductionVariable *)0x0)) {
LAB_0044d302:
    if (instr == (Instr *)0x0) {
      pIVar19 = (Instr *)0x0;
    }
    else {
      pIVar19 = instr->m_next;
    }
    instr_00 = instrBegin->m_next;
    if (instr_00 != pIVar19) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      pIVar29 = (Instr *)0x0;
      do {
        if ((pIVar29 != (Instr *)0x0) && (pIVar29->m_next != instr_00)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x917,
                             "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == chkInstr)"
                             ,"Modifying instr list but not using EDITING iterator!");
          if (!bVar6) goto LAB_0044d8b8;
          *puVar10 = 0;
        }
        bVar6 = IsInstrInvalidForMemOp(this,instr_00,loop,src1Val,src2Val);
        if (bVar6) goto LAB_0044d1a0;
        if ((loop->memOpInfo != (MemOpInfo *)0x0) &&
           (this_01 = (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                      loop->memOpInfo->candidates,
           (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
           (this_01->super_SListNodeBase<Memory::ArenaAllocator>).next != this_01)) {
          ppMVar20 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (this_01);
          if (((*ppMVar20)->type == MEMCOPY) &&
             ((pMVar21 = Loop::MemOpCandidate::AsMemCopy(*ppMVar20),
              (pMVar21->super_MemOpCandidate).base == 0xffffffff &&
              (bVar6 = IR::Instr::HasSymUse(instr_00,pMVar21->transferSym), bVar6)))) {
            loop->field_0x179 = loop->field_0x179 & 0xfb;
            if (DAT_015d346a != '\x01') {
              return false;
            }
            pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
            uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
            pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
            uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
            bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar8,uVar9);
            if (!bVar6) {
              pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
              uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
              pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
              uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
              bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemCopyPhase,uVar8,uVar9);
              if (!bVar6) {
                return false;
              }
            }
            Output::Print(L"TRACE MemCopy:");
            pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
            pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar11);
            pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
            pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_c8);
            uVar8 = Loop::GetLoopNumber(loop);
            Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar8);
            pSVar22 = pMVar21->transferSym;
            if (pSVar22 == (StackSym *)0x0) {
              pSVar22 = (StackSym *)0x0;
            }
            else if (pSVar22->m_type != TyVar) {
              pSVar22 = StackSym::GetVarEquivSym(pSVar22,(Func *)0x0);
            }
            if (pSVar22 == (StackSym *)0x0) {
              uVar27 = 0xffffffff;
            }
            else {
              uVar27 = (ulong)(pSVar22->super_Sym).m_id;
            }
            Output::Print(L"Found illegal use of LdElemI value(s%d)",uVar27);
            IR::Instr::DumpByteCodeOffset(instr_00);
            pcVar13 = Js::OpCodeUtil::GetOpCodeName(instr_00->m_opcode);
            Output::Print(L" (%s)",pcVar13);
            Output::Print(L"\n");
            Output::Flush();
            return false;
          }
        }
        ppIVar1 = &instr_00->m_next;
        pIVar29 = instr_00;
        instr_00 = *ppIVar1;
      } while (*ppIVar1 != pIVar19);
    }
    if (instr->m_dst == (Opnd *)0x0) {
      return true;
    }
    if (instr->m_opcode == IncrLoopBodyCount) {
      return true;
    }
    if (loop->memOpInfo == (MemOpInfo *)0x0) {
      return true;
    }
    pIVar19 = instr->m_prev;
    if ((pIVar19 != (Instr *)0x0 && instr->m_opcode == Ld_I4) &&
       ((((pIVar19->m_opcode - 0x1c0 < 2 || (pIVar19->m_opcode == Ld_A)) &&
         (OVar7 = IR::Opnd::GetKind(instr->m_src1), OVar7 == OpndKindReg)) &&
        ((OVar7 = IR::Opnd::GetKind(instr->m_dst), OVar7 == OpndKindReg &&
         (OVar7 = IR::Opnd::GetKind(pIVar19->m_dst), OVar7 == OpndKindReg)))))) {
      pSVar22 = IR::Opnd::GetStackSym(instr->m_dst);
      pSVar23 = IR::Opnd::GetStackSym(pIVar19->m_src1);
      if (pSVar22 == pSVar23) {
        pSVar22 = IR::Opnd::GetStackSym(instr->m_src1);
        pSVar23 = IR::Opnd::GetStackSym(pIVar19->m_dst);
        if (pSVar22 == pSVar23) {
          return true;
        }
      }
    }
    this_02 = loop->memOpInfo->inductionVariableChangeInfoMap;
    pSVar22 = IR::Opnd::GetStackSym(instr->m_dst);
    if (pSVar22 == (StackSym *)0x0) {
      pSVar22 = (StackSym *)0x0;
    }
    else if (pSVar22->m_type != TyVar) {
      pSVar22 = StackSym::GetVarEquivSym(pSVar22,(Func *)0x0);
    }
    if (pSVar22 == (StackSym *)0x0) {
      local_c8[0] = 0xffffffff;
    }
    else {
      local_c8[0] = (pSVar22->super_Sym).m_id;
    }
    bVar6 = JsUtil::
            BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(this_02,local_c8);
    if (!bVar6) {
      return true;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x94a,
                       "(!instr->GetDst() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || !loop->memOpInfo || (instr->m_opcode == Js::OpCode::Ld_I4 && prevInstr && (prevInstr->m_opcode == Js::OpCode::Add_I4 || prevInstr->m_opcode == Js::OpCode::Sub_I4 || prevInstr->m_opcode == Js::OpCode::Ld_A ) && instr->GetSrc1()->IsRegOpnd() && instr->GetDst()->IsRegOpnd() && prevInstr->GetDst()->IsRegOpnd() && instr->GetDst()->GetStackSym() == prevInstr->GetSrc1()->GetStackSym() && instr->GetSrc1()->GetStackSym() == prevInstr->GetDst()->GetStackSym()) || !loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(GetVarSymID(instr->GetDst()->GetStackSym())))"
                       ,
                       "!instr->GetDst() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || !loop->memOpInfo || (instr->m_opcode == Js::OpCode::Ld_I4 && prevInstr && (prevInstr->m_opcode == Js::OpCode::Add_I4 || prevInstr->m_opcode == Js::OpCode::Sub_I4 || prevInstr->m_opcode == Js::OpCode::Ld_A ) && instr->GetSrc1()->IsRegOpnd() && instr->GetDst()->IsRegOpnd() && prevInstr->GetDst()->IsRegOpnd() && instr->GetDst()->GetStackSym() == prevInstr->GetSrc1()->GetStackSym() && instr->GetSrc1()->GetStackSym() == prevInstr->GetDst()->GetStackSym()) || !loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(GetVarSymID(instr->GetDst()->GetStackSym()))"
                      );
    if (bVar6) {
      *puVar10 = 0;
      return true;
    }
LAB_0044d8b8:
    pcVar5 = (code *)invalidInstructionException();
    (*pcVar5)();
  }
  this_00 = instr->m_src2;
  OVar7 = IR::Opnd::GetKind(this_00);
  if (OVar7 == OpndKindReg) {
    pBVar4 = this->currentBlock;
    pRVar17 = IR::Opnd::AsRegOpnd(this_00);
    pVVar18 = GlobOptBlockData::FindValue(&pBVar4->globOptData,&pRVar17->m_sym->super_Sym);
    if (pVVar18 == (Value *)0x0) goto LAB_0044d514;
    if (pVVar18->valueInfo == (ValueInfo *)0x0) {
      bVar6 = false;
    }
    else {
      bVar6 = ValueInfo::TryGetIntConstantValue(pVVar18->valueInfo,(int32 *)local_34,false);
      bVar6 = local_34[0] == 1 && bVar6;
    }
LAB_0044d5aa:
    Loop::EnsureMemOpVariablesInitialized(loop);
    if (bVar6) {
      bVar6 = JsUtil::
              BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(loop->memOpInfo->inductionVariableChangeInfoMap,local_c8);
      if (!bVar6) {
        local_34[0] = CONCAT31(local_34[0]._1_3_,bVar26) | 1;
        JsUtil::
        BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)loop->memOpInfo->inductionVariableChangeInfoMap,local_c8,
                   (InductionVariableChangeInfo *)local_34);
        if (*(SymID *)&this_04->intConstantToStackSymMap == local_c8[0]) {
          return true;
        }
        goto LAB_0044d6ee;
      }
      local_34[0] = (uint)local_34[0]._1_3_ << 8;
      pIVar25 = JsUtil::
                BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::Lookup(loop->memOpInfo->inductionVariableChangeInfoMap,local_c8,
                         (InductionVariableChangeInfo *)local_34);
      local_34[0] = CONCAT31(local_34[0]._1_3_,
                             ((char)*pIVar25 + 1U) - ((~(byte)*pIVar25 & 0x7f) == 0) & 0x7f | bVar26
                            );
      JsUtil::
      BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)loop->memOpInfo->inductionVariableChangeInfoMap,local_c8,
                 (InductionVariableChangeInfo *)local_34);
      if (*(SymID *)&this_04->intConstantToStackSymMap == local_c8[0]) {
        return true;
      }
      goto LAB_0044d691;
    }
  }
  else {
    OVar7 = IR::Opnd::GetKind(this_00);
    if (OVar7 == OpndKindIntConst) {
      pIVar24 = IR::Opnd::AsIntConstOpnd(this_00);
      bVar6 = (pIVar24->super_EncodableOpnd<long>).m_value == 1;
      goto LAB_0044d5aa;
    }
LAB_0044d514:
    Loop::EnsureMemOpVariablesInitialized(loop);
  }
  local_34[0] = CONCAT31(local_34[0]._1_3_,0x7f);
  bVar6 = JsUtil::
          BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(loop->memOpInfo->inductionVariableChangeInfoMap,local_c8);
  this_03 = loop->memOpInfo->inductionVariableChangeInfoMap;
  if (!bVar6) {
    JsUtil::
    BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this_03,local_c8,(InductionVariableChangeInfo *)local_34);
    if (*(SymID *)&this_04->intConstantToStackSymMap == local_c8[0]) {
      return true;
    }
LAB_0044d6ee:
    JsUtil::
    BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)loop->memOpInfo->inductionVariableChangeInfoMap,
               (uint *)&this_04->intConstantToStackSymMap,(InductionVariableChangeInfo *)local_34);
    return true;
  }
  JsUtil::
  BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)this_03,local_c8,(InductionVariableChangeInfo *)local_34);
  if (*(SymID *)&this_04->intConstantToStackSymMap == local_c8[0]) {
    return true;
  }
LAB_0044d691:
  JsUtil::
  BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<unsigned_int,Loop::InductionVariableChangeInfo,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)loop->memOpInfo->inductionVariableChangeInfoMap,
             (uint *)&this_04->intConstantToStackSymMap,(InductionVariableChangeInfo *)local_34);
  return true;
}

Assistant:

bool
GlobOpt::CollectMemOpInfo(IR::Instr *instrBegin, IR::Instr *instr, Value *src1Val, Value *src2Val)
{
    Assert(this->currentBlock->loop);

    Loop *loop = this->currentBlock->loop;

    if (!loop->blockList.HasTwo())
    {
        //  We support memcopy and memset for loops which have only two blocks.
        return false;
    }

    if (loop->GetLoopFlags().isInterpreted && !loop->GetLoopFlags().memopMinCountReached)
    {
        TRACE_MEMOP_VERBOSE(loop, instr, _u("minimum loop count not reached"))
        loop->doMemOp = false;
        return false;
    }
    Assert(loop->doMemOp);

    bool isIncr = true, isChangedByOne = false;

    switch (instr->m_opcode)
    {
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        if (!CollectMemOpStElementI(instr, loop))
        {
            loop->doMemOp = false;
            return false;
        }
        break;
    case Js::OpCode::LdElemI_A:
        if (!CollectMemOpLdElementI(instr, loop))
        {
            loop->doMemOp = false;
            return false;
        }
        break;
    case Js::OpCode::Sub_I4:
        isIncr = false;
    case Js::OpCode::Add_I4:
    {
        // The only case in which these OpCodes can contribute to an inductionVariableChangeInfo
        // is when the induction variable is being modified and overwritten aswell (ex: j = j + 1)
        // and not when the induction variable is modified but not overwritten (ex: k = j + 1).
        // This can either be detected in IR as
        // s1     = Add_I4 s1     1  // Case #1, can be seen with "j++".
        // or as
        // s4(s2) = Add_I4 s3(s1) 1  // Case #2, can be see with "j = j + 1".
        // s1     = Ld_A   s2
        bool isInductionVar = false;
        IR::Instr* nextInstr = instr->m_next;
        if (
            // Checks for Case #1 and Case #2
            instr->GetDst()->GetStackSym() != nullptr &&
            instr->GetDst()->IsRegOpnd() &&
            (
                // Checks for Case #1
                (instr->GetDst()->GetStackSym() == instr->GetSrc1()->GetStackSym()) ||

                // Checks for Case #2
                (nextInstr&& nextInstr->m_opcode == Js::OpCode::Ld_A &&
                 nextInstr->GetSrc1()->IsRegOpnd() &&
                 nextInstr->GetDst()->IsRegOpnd() &&
                 GetVarSymID(instr->GetDst()->GetStackSym()) == nextInstr->GetSrc1()->GetStackSym()->m_id &&
                 GetVarSymID(instr->GetSrc1()->GetStackSym()) == nextInstr->GetDst()->GetStackSym()->m_id)
            )
        )
        {
            isInductionVar = true;
        }
        
        // Even if dstIsInductionVar then dst == src1 so it's safe to use src1 as the induction sym always.
        StackSym* sym = instr->GetSrc1()->GetStackSym();

        SymID inductionSymID = GetVarSymID(sym);

        if (isInductionVar && IsSymIDInductionVariable(inductionSymID, this->currentBlock->loop))
        {
            if (!isChangedByOne)
            {
                IR::Opnd *src1, *src2;
                src1 = instr->GetSrc1();
                src2 = instr->GetSrc2();

                if (src2->IsRegOpnd())
                {
                    Value *val = CurrentBlockData()->FindValue(src2->AsRegOpnd()->m_sym);
                    if (val)
                    {
                        ValueInfo *vi = val->GetValueInfo();
                        int constValue;
                        if (vi && vi->TryGetIntConstantValue(&constValue))
                        {
                            if (constValue == 1)
                            {
                                isChangedByOne = true;
                            }
                        }
                    }
                }
                else if (src2->IsIntConstOpnd())
                {
                    if (src2->AsIntConstOpnd()->GetValue() == 1)
                    {
                        isChangedByOne = true;
                    }
                }
            }

            loop->EnsureMemOpVariablesInitialized();
            if (!isChangedByOne)
            {
                Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { Js::Constants::InvalidLoopUnrollFactor, 0 };

                if (!loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID))
                {
                    loop->memOpInfo->inductionVariableChangeInfoMap->Add(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Add(sym->m_id, inductionVariableChangeInfo);
                    }
                }
                else
                {
                    loop->memOpInfo->inductionVariableChangeInfoMap->Item(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Item(sym->m_id, inductionVariableChangeInfo);
                    }
                }
            }
            else
            {
                if (!loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID))
                {
                    Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { 1, isIncr };
                    loop->memOpInfo->inductionVariableChangeInfoMap->Add(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Add(sym->m_id, inductionVariableChangeInfo);
                    }
                }
                else
                {
                    Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { 0, 0 };
                    inductionVariableChangeInfo = loop->memOpInfo->inductionVariableChangeInfoMap->Lookup(inductionSymID, inductionVariableChangeInfo);

                    // If inductionVariableChangeInfo.unroll has been invalidated, do
                    // not modify the Js::Constants::InvalidLoopUnrollFactor value
                    if (inductionVariableChangeInfo.unroll != Js::Constants::InvalidLoopUnrollFactor)
                    {
                        inductionVariableChangeInfo.unroll++;
                    }
                    inductionVariableChangeInfo.isIncremental = isIncr;
                    loop->memOpInfo->inductionVariableChangeInfoMap->Item(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Item(sym->m_id, inductionVariableChangeInfo);
                    }
                }
            }
            break;
        }
        // Fallthrough if not an induction variable
    }
    default:
        FOREACH_INSTR_IN_RANGE(chkInstr, instrBegin->m_next, instr)
        {
            if (IsInstrInvalidForMemOp(chkInstr, loop, src1Val, src2Val))
            {
                loop->doMemOp = false;
                return false;
            }

            // Make sure this instruction doesn't use the memcopy transfer sym before it is checked by StElemI
            if (loop->memOpInfo && !loop->memOpInfo->candidates->Empty())
            {
                Loop::MemOpCandidate* prevCandidate = loop->memOpInfo->candidates->Head();
                if (prevCandidate->IsMemCopy())
                {
                    Loop::MemCopyCandidate* memcopyCandidate = prevCandidate->AsMemCopy();
                    if (memcopyCandidate->base == Js::Constants::InvalidSymID)
                    {
                        if (chkInstr->HasSymUse(memcopyCandidate->transferSym))
                        {
                            loop->doMemOp = false;
                            TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, chkInstr, _u("Found illegal use of LdElemI value(s%d)"), GetVarSymID(memcopyCandidate->transferSym));
                            return false;
                        }
                    }
                }
            }
        }
        NEXT_INSTR_IN_RANGE;
        IR::Instr* prevInstr = instr->m_prev;

        // If an instr where the dst is an induction variable (and thus is being written to) is not caught by a case in the above
        // switch statement (which implies that this instr does not contributes to a inductionVariableChangeInfo) and in the default
        // case does not set doMemOp to false (which implies that this instr does not invalidate this MemOp), then FailFast as we
        // should not be performing a MemOp under these conditions. 
        AssertOrFailFast(!instr->GetDst() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || !loop->memOpInfo ||

            // Refer to "Case #2" described above in this function. For the following IR:
            // Line #1: s4(s2) = Add_I4 s3(s1) 1
            // Line #2: s3(s1) = Ld_A   s4(s2)
            // do not consider line #2 as a violating instr
            (instr->m_opcode == Js::OpCode::Ld_I4 &&
                // note Ld_A is for the case where the add was 0
                prevInstr && (prevInstr->m_opcode == Js::OpCode::Add_I4 ||
                              prevInstr->m_opcode == Js::OpCode::Sub_I4 ||
                              prevInstr->m_opcode == Js::OpCode::Ld_A   ) &&
                instr->GetSrc1()->IsRegOpnd() &&
                instr->GetDst()->IsRegOpnd() &&
                prevInstr->GetDst()->IsRegOpnd() &&
                instr->GetDst()->GetStackSym() == prevInstr->GetSrc1()->GetStackSym() &&
                instr->GetSrc1()->GetStackSym() == prevInstr->GetDst()->GetStackSym()) ||

            !loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(GetVarSymID(instr->GetDst()->GetStackSym())));
    }

    return true;
}